

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::ProcessNoImplicitCallDef(BackwardPass *this,Instr *instr)

{
  IRKind IVar1;
  Opnd *pOVar2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BackwardPass *this_01;
  BasicBlock *pBVar3;
  BasicBlock *pBVar4;
  code *pcVar5;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  ushort uVar10;
  undefined8 in_RAX;
  undefined4 *puVar11;
  undefined7 extraout_var;
  RegOpnd *pRVar12;
  SymOpnd *pSVar13;
  Instr *pIVar14;
  Instr *pIVar15;
  Type *ppFVar16;
  long lVar17;
  uint uVar18;
  BasicBlock *this_02;
  BackwardPass *this_03;
  TempObjectTracker *this_04;
  _func_int **pp_Var19;
  byte bVar20;
  ulong uVar21;
  StackSym *pSVar22;
  Func **ppFVar23;
  Iterator IStack_b8;
  BackwardPass *pBStack_a8;
  Iterator IStack_a0;
  Instr *pIStack_90;
  Instr *pIStack_88;
  Instr *pIStack_80;
  Instr *pIStack_78;
  byte bStack_69;
  BackwardPass *pBStack_68;
  BackwardPass *pBStack_60;
  ulong uStack_58;
  Instr *pIStack_50;
  Opnd *pOStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)0x3e9222;
    Js::Throw::LogAssert();
    pcStack_40 = (code *)0x3e9232;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    pcStack_40 = (code *)0x3e925a;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1183,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar7) goto LAB_003e97bf;
    *puVar11 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)0x3e927c;
    Js::Throw::LogAssert();
    pcStack_40 = (code *)0x3e928c;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    pcStack_40 = (code *)0x3e92b4;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1184,"(instr)","instr");
    if (!bVar7) goto LAB_003e97bf;
    *puVar11 = 0;
  }
  pOVar2 = instr->m_dst;
  if (pOVar2 == (Opnd *)0x0) {
    return;
  }
  pcStack_40 = (code *)0x3e92d8;
  OVar8 = IR::Opnd::GetKind(pOVar2);
  if (OVar8 == OpndKindSym) {
    pcStack_40 = (code *)0x3e9358;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e936a;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e937a;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e93a2;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_003e97bf;
      *puVar11 = 0;
    }
    pp_Var19 = pOVar2[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var19 + 0x14) != '\x02') {
      return;
    }
  }
  else {
    if (OVar8 != OpndKindReg) {
      return;
    }
    pcStack_40 = (code *)0x3e92f0;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e9302;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e9312;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e933a;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_003e97bf;
      *puVar11 = 0;
    }
    pp_Var19 = pOVar2[1]._vptr_Opnd;
  }
  pcStack_40 = (code *)0x3e93d7;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallUses,*(BVIndex *)(pp_Var19 + 2));
  this_00 = this->currentBlock->noImplicitCallNoMissingValuesUses;
  if (BVar9 == '\0') {
    pcStack_40 = (code *)0x3e9499;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,*(BVIndex *)(pp_Var19 + 2));
    if (BVar9 != '\0') {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e94ab;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e94bb;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e94e3;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a1,
                         "(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id))",
                         "!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id)");
      if (!bVar7) goto LAB_003e97bf;
      *puVar11 = 0;
    }
    pcStack_40 = (code *)0x3e9507;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallNativeArrayUses,*(BVIndex *)(pp_Var19 + 2))
    ;
    if (BVar9 != '\0') {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e9519;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e9529;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e9551;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a2,
                         "(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id))",
                         "!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id)");
      if (!bVar7) goto LAB_003e97bf;
      *puVar11 = 0;
    }
    pcStack_40 = (code *)0x3e9575;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                       *(BVIndex *)(pp_Var19 + 2));
    if (BVar9 != '\0') {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e9587;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e9597;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e95bf;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a3,
                         "(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id))"
                         ,
                         "!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id)"
                        );
      if (!bVar7) goto LAB_003e97bf;
      *puVar11 = 0;
    }
    pcStack_40 = (code *)0x3e95e3;
    BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallArrayLengthSymUses,
                       *(BVIndex *)(pp_Var19 + 2));
    if (BVar9 == '\0') {
      return;
    }
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)0x3e95f9;
    Js::Throw::LogAssert();
    pcStack_40 = (code *)0x3e9609;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    pcStack_40 = (code *)0x3e9631;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11a4,
                       "(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id))",
                       "!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id)");
    if (bVar7) {
      *puVar11 = 0;
      return;
    }
    goto LAB_003e97bf;
  }
  pcStack_40 = (code *)0x3e93f4;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear(this_00,*(BVIndex *)(pp_Var19 + 2));
  uVar21 = CONCAT71(extraout_var,BVar9) & 0xffffffff;
  pcStack_40 = (code *)0x3e940c;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallNativeArrayUses,*(BVIndex *)(pp_Var19 + 2));
  uStack_38 = CONCAT17(BVar9,(undefined7)uStack_38);
  pcStack_40 = (code *)0x3e9424;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                     *(BVIndex *)(pp_Var19 + 2));
  uStack_38._0_7_ = CONCAT16(BVar9,(undefined6)uStack_38);
  pIVar15 = (Instr *)(ulong)*(uint *)(pp_Var19 + 2);
  pcStack_40 = (code *)0x3e943c;
  BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallArrayLengthSymUses,*(uint *)(pp_Var19 + 2));
  uStack_38._0_6_ = CONCAT15(BVar9,(undefined5)uStack_38);
  this_01 = (BackwardPass *)instr->m_src1;
  if (this_01 == (BackwardPass *)0x0) {
    return;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    pcStack_40 = (code *)0x3e945d;
    bVar7 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
    if (!bVar7) {
      return;
    }
  }
  pcStack_40 = (code *)0x3e946d;
  OVar8 = IR::Opnd::GetKind(pOVar2);
  if (OVar8 == OpndKindReg) {
    pcStack_40 = (code *)0x3e947d;
    OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar8 != OpndKindReg) goto LAB_003e9644;
    pcStack_40 = (code *)0x3e948f;
    bVar7 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
  }
  else {
LAB_003e9644:
    pcStack_40 = (code *)0x3e964c;
    OVar8 = IR::Opnd::GetKind(pOVar2);
    if (OVar8 == OpndKindReg) {
      pcStack_40 = (code *)0x3e9658;
      OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
      if (OVar8 != OpndKindSym) goto LAB_003e966e;
      pcStack_40 = (code *)0x3e9664;
      pSVar13 = IR::Opnd::AsSymOpnd((Opnd *)this_01);
      if (pSVar13->m_sym->m_kind != SymKindProperty) goto LAB_003e966e;
    }
    else {
LAB_003e966e:
      pcStack_40 = (code *)0x3e9676;
      OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
      if (OVar8 != OpndKindReg) {
        return;
      }
      uStack_38._0_4_ = CONCAT22((pOVar2->m_valueType).field_0.bits,(undefined2)uStack_38);
      pcStack_40 = (code *)0x3e968f;
      bVar7 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&uStack_38 + 2));
      if (!bVar7) {
        return;
      }
    }
    pcStack_40 = (code *)0x3e969f;
    bVar7 = IR::Instr::TransfersSrcValue(instr);
  }
  if (bVar7 == false) {
    return;
  }
  pcStack_40 = (code *)0x3e96af;
  this_03 = this_01;
  OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar8 == OpndKindSym) {
    pcStack_40 = (code *)0x3e96d5;
    pSVar13 = IR::Opnd::AsSymOpnd((Opnd *)this_01);
    pSVar22 = (StackSym *)pSVar13->m_sym;
    if ((pSVar22->super_Sym).m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      pcStack_40 = (code *)0x3e96ee;
      Js::Throw::LogAssert();
      pcStack_40 = (code *)0x3e96fe;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      pcStack_40 = (code *)0x3e9726;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11d5,"(srcSym->IsPropertySym())","srcSym->IsPropertySym()");
      if (!bVar7) {
LAB_003e97bf:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
    }
LAB_003e9735:
    pcStack_40 = (code *)0x3e9749;
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->currentBlock->noImplicitCallUses,(pSVar22->super_Sym).m_id);
    if ((char)uVar21 != '\0') {
      pcStack_40 = (code *)0x3e9762;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallNoMissingValuesUses,(pSVar22->super_Sym).m_id);
    }
    if (uStack_38._7_1_ != '\0') {
      pcStack_40 = (code *)0x3e977c;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallNativeArrayUses,(pSVar22->super_Sym).m_id);
    }
    if (uStack_38._6_1_ != '\0') {
      pcStack_40 = (code *)0x3e9796;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                 (pSVar22->super_Sym).m_id);
    }
    if (uStack_38._5_1_ != '\0') {
      pcStack_40 = (code *)0x3e97b0;
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->noImplicitCallArrayLengthSymUses,(pSVar22->super_Sym).m_id);
    }
    return;
  }
  if (OVar8 == OpndKindReg) {
    pcStack_40 = (code *)0x3e96c7;
    pRVar12 = IR::Opnd::AsRegOpnd((Opnd *)this_01);
    pSVar22 = pRVar12->m_sym;
    goto LAB_003e9735;
  }
  pcStack_40 = ProcessBailOnNoProfile;
  ProcessNoImplicitCallDef();
  pBStack_68 = this;
  pBStack_60 = this_01;
  uStack_58 = uVar21;
  pIStack_50 = instr;
  pOStack_48 = pOVar2;
  pcStack_40 = (code *)&stack0xfffffffffffffff8;
  if (this_03->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    pcStack_40 = (code *)&stack0xfffffffffffffff8;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2085,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar7) goto LAB_003e9fe0;
    *puVar11 = 0;
  }
  if (pIVar15->m_opcode != BailOnNoProfile) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2086,"(instr->m_opcode == Js::OpCode::BailOnNoProfile)",
                       "instr->m_opcode == Js::OpCode::BailOnNoProfile");
    if (!bVar7) goto LAB_003e9fe0;
    *puVar11 = 0;
  }
  if ((pIVar15->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2087,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar7) goto LAB_003e9fe0;
    *puVar11 = 0;
  }
  if (this_02 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2088,"(block)","block");
    if (!bVar7) goto LAB_003e9fe0;
    *puVar11 = 0;
  }
  if (this_03->currentPrePassLoop != (Loop *)0x0) {
    return;
  }
  if ((this_03->currentRegion != (Region *)0x0) &&
     ((byte)(this_03->currentRegion->type - RegionTypeCatch) < 2)) {
    return;
  }
  pIVar14 = pIVar15->m_prev;
  if (((pIVar14->m_kind == InstrKindProfiledLabel) || (pIVar14->m_kind == InstrKindLabel)) &&
     (((ulong)pIVar14[1].m_func & 2) != 0)) {
    if (this_03->tag != BackwardPhase) {
      return;
    }
    bVar7 = SatisfyMarkTempObjectsConditions(this_03);
    if (!bVar7) {
      return;
    }
    this_04 = this_02->tempObjectTracker;
  }
  else {
    pIStack_90 = (Instr *)&pIVar15->m_prev;
    pBStack_a8 = this_03;
    pIStack_80 = pIVar15;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIStack_88 = (Instr *)0x0;
    while ((pIStack_78 = pIVar14, 6 < pIVar14->m_kind ||
           ((0x68U >> (pIVar14->m_kind & 0x1f) & 1) == 0))) {
      bVar7 = IR::Instr::DontHoistBailOnNoProfileAboveInGeneratorFunction(pIVar14);
      if ((bVar7) && (bVar7 = pIStack_88 != (Instr *)0x0, pIStack_88 = pIVar14, bVar7)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20ab,"(insertionPointForGenerator == nullptr)",
                           "insertionPointForGenerator == nullptr");
        if (!bVar7) goto LAB_003e9fe0;
        *puVar11 = 0;
        pIStack_88 = pIStack_78;
        pIVar14 = pIStack_78;
      }
      uVar18 = pIVar14->m_opcode - 0x248;
      if (((uVar18 < 7) && ((0x67U >> (uVar18 & 0x1f) & 1) != 0)) ||
         ((bVar7 = OpCodeAttr::CallInstr(pIVar14->m_opcode), bVar7 &&
          (pIStack_78->m_prev->m_opcode != BailOnNoProfile)))) break;
      pIVar14 = pIStack_78->m_prev;
    }
    pIVar15 = pIStack_80;
    if ((pIStack_78->m_kind != InstrKindLabel) && (pIStack_78->m_kind != InstrKindProfiledLabel)) {
LAB_003e9f7d:
      BasicBlock::RemoveInstr(this_02,pIVar15);
      return;
    }
    pIVar14 = IR::Instr::GetNextRealInstrOrLabel(pIStack_78);
    if ((pIVar14->m_opcode == Ld_A) &&
       (OVar8 = IR::Opnd::GetKind(pIVar14->m_dst), OVar8 == OpndKindReg)) {
      pOVar2 = pIVar14->m_dst;
      OVar8 = IR::Opnd::GetKind(pOVar2);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar7) {
LAB_003e9fe0:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar11 = 0;
      }
      if (((ushort)pOVar2[1].m_valueType.field_0 & 8) != 0) goto LAB_003e9f7d;
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      pIVar15 = (Instr *)pIStack_90->_vptr_Instr;
      pIStack_90 = pIVar15;
      if ((pIVar15->m_kind < 7) && ((0x68U >> (pIVar15->m_kind & 0x1f) & 1) != 0)) break;
      if (pIVar15->m_opcode == BailOnNoProfile) {
        if ((pIVar15->field_0x38 & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x20e4,"(!curInstr->HasBailOutInfo())","!curInstr->HasBailOutInfo()");
          if (!bVar7) goto LAB_003e9fe0;
          *puVar11 = 0;
        }
        pIVar15 = pIStack_90->m_next;
        IR::Instr::Remove(pIVar15->m_prev);
      }
      pIStack_90 = (Instr *)&pIVar15->m_prev;
    }
    IR::Instr::Unlink(pIStack_80);
    IStack_b8.list =
         &(this_02->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    IStack_b8.current = &(IStack_b8.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bStack_69 = pIStack_88 == (Instr *)0x0;
LAB_003e9c17:
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_b8.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_003e9fe0;
      *puVar11 = 0;
    }
    IStack_b8.current =
         (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&(IStack_b8.current)->next)->
         super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_b8.current !=
        IStack_b8.list) {
      ppFVar16 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           (&IStack_b8);
      pBVar3 = (*ppFVar16)->predBlock;
      if (pBVar3 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x20f3,"(pred)","pred");
        if (!bVar7) goto LAB_003e9fe0;
        *puVar11 = 0;
      }
      if (((this_02->field_0x18 & 4) == 0) || (pBVar3->loop != this_02->loop)) {
        pIVar15 = pBVar3->firstInstr;
        IVar1 = pIVar15->m_kind;
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar7) goto LAB_003e9fe0;
          *puVar11 = 0;
        }
        if ((Region *)pIVar15[1].m_src2 != pBStack_a8->currentRegion) goto LAB_003e9f13;
        IStack_a0.list =
             &(pBVar3->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        bVar20 = bStack_69;
        IStack_a0.current = &(IStack_a0.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        do {
          if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_a0.current ==
              (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) goto LAB_003e9fe0;
            *puVar11 = 0;
          }
          IStack_a0.current =
               (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                &(IStack_a0.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_a0.current ==
              IStack_a0.list) break;
          ppFVar16 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               (&IStack_a0);
          pBVar4 = (*ppFVar16)->succBlock;
          if (pBVar4 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x2105,"(predSucc)","predSucc");
            if (!bVar7) goto LAB_003e9fe0;
            *puVar11 = 0;
          }
          if (pBVar4 == this_02) {
            bVar7 = false;
          }
          else {
            bVar7 = (pBVar4->field_0x18 & 0x80) == 0;
            bVar20 = bVar20 & (char)pBVar4->field_0x18 >> 7;
          }
          pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IStack_a0.current;
        } while (!bVar7);
        IStack_a0.current = &pSVar6->super_SListNodeBase<Memory::ArenaAllocator>;
        if ((bVar20 & 1) != 0) {
          pBVar4 = pBVar3->next;
          ppFVar23 = &pBVar3->func;
          if (pBVar4 != (BasicBlock *)0x0) {
            ppFVar23 = (Func **)&pBVar4->firstInstr;
          }
          lVar17 = 0x18;
          if (pBVar4 == (BasicBlock *)0x0) {
            lVar17 = 0xd0;
          }
          pIVar15 = *(Instr **)((long)&(*ppFVar23)->m_alloc + lVar17);
          pIVar14 = IR::Instr::Copy(pIStack_80,true);
          IVar1 = pIVar15->m_kind;
          if ((((IVar1 == InstrKindBranch) || (IVar1 == InstrKindExit)) ||
              (pIVar15->m_opcode - 0x23 < 3)) || (pIVar15->m_opcode - 0x173 < 2)) {
            if (pIVar15->m_prev->m_opcode != BailOnNoProfile) {
              if ((IVar1 == InstrKindBranch) && (((ulong)pIVar15[1]._vptr_Instr & 2) == 0)) {
                pIVar14->m_func = pIVar15->m_func;
                IR::Instr::InsertBefore(pIVar15,pIVar14);
              }
              goto LAB_003e9c17;
            }
          }
          else if (pIVar15->m_opcode != BailOnNoProfile) {
            pIVar14->m_func = pIVar15->m_func;
            IR::Instr::InsertAfter(pIVar15,pIVar14);
            goto LAB_003e9c17;
          }
          IR::Instr::Free(pIVar14);
        }
      }
      goto LAB_003e9c17;
    }
    IStack_b8.current = (NodeBase *)0x0;
LAB_003e9f13:
    pIVar15 = pIStack_80;
    if (this_02->number == 0) {
      IR::Instr::Free(pIStack_80);
      return;
    }
    *(byte *)&pIStack_78[1].m_func = *(byte *)&pIStack_78[1].m_func | 0x22;
    pIStack_80->m_func = pIStack_90->m_func;
    if (pIStack_88 == (Instr *)0x0) {
      IR::Instr::InsertAfter(pIStack_90,pIStack_80);
      uVar10 = (ushort)*(undefined4 *)&this_02->field_0x18 | 0x80;
    }
    else {
      IR::Instr::InsertAfter(pIStack_88,pIStack_80);
      uVar10 = *(ushort *)&this_02->field_0x18 & 0xff7f;
    }
    *(ushort *)&this_02->field_0x18 = uVar10;
    if (pBStack_a8->tag != BackwardPhase) {
      return;
    }
    bVar7 = SatisfyMarkTempObjectsConditions(pBStack_a8);
    if (!bVar7) {
      return;
    }
    this_04 = this_02->tempObjectTracker;
  }
  ObjectTemp::ProcessBailOnNoProfile(&this_04->super_ObjectTemp,pIVar15);
  return;
}

Assistant:

void
BackwardPass::ProcessNoImplicitCallDef(IR::Instr *const instr)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(instr);

    IR::Opnd *const dst = instr->GetDst();
    if(!dst)
    {
        return;
    }

    Sym *dstSym;
    switch(dst->GetKind())
    {
        case IR::OpndKindReg:
            dstSym = dst->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            dstSym = dst->AsSymOpnd()->m_sym;
            if(!dstSym->IsPropertySym())
            {
                return;
            }
            break;

        default:
            return;
    }

    if(!currentBlock->noImplicitCallUses->TestAndClear(dstSym->m_id))
    {
        Assert(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id));
        return;
    }
    const bool transferNoMissingValuesUse = !!currentBlock->noImplicitCallNoMissingValuesUses->TestAndClear(dstSym->m_id);
    const bool transferNativeArrayUse = !!currentBlock->noImplicitCallNativeArrayUses->TestAndClear(dstSym->m_id);
    const bool transferJsArrayHeadSegmentSymUse =
        !!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->TestAndClear(dstSym->m_id);
    const bool transferArrayLengthSymUse = !!currentBlock->noImplicitCallArrayLengthSymUses->TestAndClear(dstSym->m_id);

    IR::Opnd *const src = instr->GetSrc1();

    // Stop attempting to transfer noImplicitCallUses symbol if the instr is not a transfer instr (based on the opcode's 
    // flags) or does not have the attributes to be a transfer instr (based on the existance of src and src2).
    if(!src || (instr->GetSrc2() && !OpCodeAttr::NonIntTransfer(instr->m_opcode)))
    {
        return;
    }
    if(dst->IsRegOpnd() && src->IsRegOpnd())
    {
        if(!OpCodeAttr::NonIntTransfer(instr->m_opcode))
        {
            return;
        }
    }
    else if(
        !(
            // LdFld or similar
            (dst->IsRegOpnd() && src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym()) ||

            // StFld or similar. Don't transfer a field opnd from StFld into the reg opnd src unless the field's value type is
            // definitely array or object with array, because only those value types require implicit calls to be disabled as
            // long as they are live. Other definite value types only require implicit calls to be disabled as long as a live
            // field holds the value, which is up to the StFld when going backwards.
            (src->IsRegOpnd() && dst->GetValueType().IsArrayOrObjectWithArray())
        ) ||
        !instr->TransfersSrcValue())
    {
        return;
    }

    Sym *srcSym = nullptr;
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            srcSym = src->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            srcSym = src->AsSymOpnd()->m_sym;
            Assert(srcSym->IsPropertySym());
            break;

        default:
            Assert(false);
            __assume(false);
    }

    currentBlock->noImplicitCallUses->Set(srcSym->m_id);
    if(transferNoMissingValuesUse)
    {
        currentBlock->noImplicitCallNoMissingValuesUses->Set(srcSym->m_id);
    }
    if(transferNativeArrayUse)
    {
        currentBlock->noImplicitCallNativeArrayUses->Set(srcSym->m_id);
    }
    if(transferJsArrayHeadSegmentSymUse)
    {
        currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Set(srcSym->m_id);
    }
    if(transferArrayLengthSymUse)
    {
        currentBlock->noImplicitCallArrayLengthSymUses->Set(srcSym->m_id);
    }
}